

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::SupportVectorRegressor::ByteSizeLong(SupportVectorRegressor *this)

{
  bool bVar1;
  SupportVectorsCase SVar2;
  int iVar3;
  size_t sVar4;
  double dVar5;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  SupportVectorRegressor *this_local;
  
  sStack_18 = 0;
  bVar1 = has_kernel(this);
  if (bVar1) {
    sStack_18 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::Kernel>(this->kernel_);
    sStack_18 = sStack_18 + 1;
  }
  bVar1 = has_coefficients(this);
  if (bVar1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Coefficients>(this->coefficients_);
    sStack_18 = sVar4 + 1 + sStack_18;
  }
  dVar5 = rho(this);
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    sStack_18 = sStack_18 + 9;
  }
  SVar2 = supportVectors_case(this);
  if (SVar2 != SUPPORTVECTORS_NOT_SET) {
    if (SVar2 == kSparseSupportVectors) {
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::SparseSupportVectors>
                        ((this->supportVectors_).sparsesupportvectors_);
      sStack_18 = sVar4 + 1 + sStack_18;
    }
    else if (SVar2 == kDenseSupportVectors) {
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::DenseSupportVectors>
                        ((this->supportVectors_).densesupportvectors_);
      sStack_18 = sVar4 + 1 + sStack_18;
    }
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar3;
  return sStack_18;
}

Assistant:

size_t SupportVectorRegressor::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SupportVectorRegressor)
  size_t total_size = 0;

  // .CoreML.Specification.Kernel kernel = 1;
  if (this->has_kernel()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->kernel_);
  }

  // .CoreML.Specification.Coefficients coefficients = 4;
  if (this->has_coefficients()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->coefficients_);
  }

  // double rho = 5;
  if (this->rho() != 0) {
    total_size += 1 + 8;
  }

  switch (supportVectors_case()) {
    // .CoreML.Specification.SparseSupportVectors sparseSupportVectors = 2;
    case kSparseSupportVectors: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *supportVectors_.sparsesupportvectors_);
      break;
    }
    // .CoreML.Specification.DenseSupportVectors denseSupportVectors = 3;
    case kDenseSupportVectors: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *supportVectors_.densesupportvectors_);
      break;
    }
    case SUPPORTVECTORS_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}